

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>
::advance_past_empty_and_deleted
          (dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
           *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
  *pdVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  
  piVar7 = this->pos;
  piVar4 = this->end;
  if (piVar7 != piVar4) {
    pdVar5 = this->ht;
    iVar8 = (pdVar5->key_info).super_Hasher.num_compares_;
    iVar2 = (pdVar5->key_info).empty_key;
    do {
      iVar1 = *piVar7;
      (pdVar5->key_info).super_Hasher.num_compares_ = iVar8 + 1;
      iVar6 = iVar8 + 1;
      if (iVar2 != iVar1) {
        if (pdVar5->num_deleted == '\0') {
          return;
        }
        iVar3 = (pdVar5->key_info).delkey;
        iVar1 = *piVar7;
        (pdVar5->key_info).super_Hasher.num_compares_ = iVar8 + 2;
        iVar6 = iVar8 + 2;
        if (iVar3 != iVar1) {
          return;
        }
      }
      iVar8 = iVar6;
      piVar7 = piVar7 + 1;
      this->pos = piVar7;
    } while (piVar7 != piVar4);
  }
  return;
}

Assistant:

void advance_past_empty_and_deleted() {
    while (pos != end && (ht->test_empty(*this) || ht->test_deleted(*this)))
      ++pos;
  }